

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O2

int Abc_ObjSopSimulate(Abc_Obj_t *pObj)

{
  char *pSop;
  int iVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  
  pSop = (char *)(pObj->field_5).pData;
  if ((pSop == (char *)0x0) || (iVar1 = Abc_SopIsExorType(pSop), iVar1 != 0)) {
    __assert_fail("pSop && !Abc_SopIsExorType(pSop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retInit.c"
                  ,0x61,"int Abc_ObjSopSimulate(Abc_Obj_t *)");
  }
  iVar1 = Abc_SopGetVarNum(pSop);
  uVar7 = 0;
  pcVar2 = pSop;
LAB_003bd728:
  cVar5 = *pcVar2;
  if (cVar5 == '\0') {
    iVar1 = Abc_SopGetPhase(pSop);
    return uVar7 ^ iVar1 == 0;
  }
  lVar4 = 0;
  uVar3 = 1;
  do {
    if (cVar5 == '0') {
      uVar6 = *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar4]] + 0x40) ^ 1;
LAB_003bd78d:
      uVar3 = uVar3 & uVar6;
    }
    else {
      if (cVar5 == '1') {
        uVar6 = *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar4]] + 0x40);
        goto LAB_003bd78d;
      }
      if ((cVar5 == '\0') || (cVar5 == ' ')) break;
    }
    cVar5 = pcVar2[lVar4 + 1];
    lVar4 = lVar4 + 1;
  } while( true );
  uVar7 = uVar7 | uVar3;
  pcVar2 = pcVar2 + (iVar1 + 3);
  goto LAB_003bd728;
}

Assistant:

int Abc_ObjSopSimulate( Abc_Obj_t * pObj )
{
    char * pCube, * pSop = (char *)pObj->pData;
    int nVars, Value, v, ResOr, ResAnd, ResVar;
    assert( pSop && !Abc_SopIsExorType(pSop) );
    // simulate the SOP of the node
    ResOr = 0;
    nVars = Abc_SopGetVarNum(pSop);
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        ResAnd = 1;
        Abc_CubeForEachVar( pCube, Value, v )
        {
            if ( Value == '0' )
                ResVar = 1 ^ ((int)(ABC_PTRUINT_T)Abc_ObjFanin(pObj, v)->pCopy);
            else if ( Value == '1' )
                ResVar = (int)(ABC_PTRUINT_T)Abc_ObjFanin(pObj, v)->pCopy;
            else
                continue;
            ResAnd &= ResVar;
        }
        ResOr |= ResAnd;
    }
    // complement the result if necessary
    if ( !Abc_SopGetPhase(pSop) )
        ResOr ^= 1;
    return ResOr;
}